

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeDataSize(BtCursor *pCur,u32 *pSize)

{
  u32 uVar1;
  
  if ((pCur->info).nSize == 0) {
    btreeParseCell(pCur->apPage[pCur->iPage],(uint)pCur->aiIdx[pCur->iPage],&pCur->info);
    pCur->curFlags = pCur->curFlags | 2;
  }
  uVar1 = (pCur->info).nPayload;
  *pSize = uVar1;
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDataSize(BtCursor *pCur, u32 *pSize){
  assert( cursorHoldsMutex(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage>=0 );
  assert( pCur->iPage<BTCURSOR_MAX_DEPTH );
  assert( pCur->apPage[pCur->iPage]->intKeyLeaf==1 );
  getCellInfo(pCur);
  *pSize = pCur->info.nPayload;
  return SQLITE_OK;
}